

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_req.cxx
# Opt level: O1

bufptr __thiscall cornerstone::snapshot_sync_req::serialize(snapshot_sync_req *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  buffer *extraout_RDX;
  buffer *extraout_RDX_00;
  _Head_base<0UL,_cornerstone::buffer_*,_false> _Var4;
  long in_RSI;
  bufptr bVar5;
  bufptr snp_buf;
  code *local_30;
  buffer *local_28;
  
  snapshot::serialize((snapshot *)&local_30);
  sVar1 = buffer::size(local_28);
  sVar2 = buffer::size(*(buffer **)(in_RSI + 0x20));
  sVar3 = buffer::pos(*(buffer **)(in_RSI + 0x20));
  buffer::alloc((buffer *)this,((sVar1 + sVar2) - sVar3) + 9);
  buffer::put((buffer *)
              (this->snapshot_).
              super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi,local_28);
  buffer::put((buffer *)
              (this->snapshot_).
              super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi,*(ulong *)(in_RSI + 0x10));
  buffer::put((buffer *)
              (this->snapshot_).
              super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi,*(byte *)(in_RSI + 0x28));
  buffer::put((buffer *)
              (this->snapshot_).
              super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi,*(buffer **)(in_RSI + 0x20));
  buffer::pos((buffer *)
              (this->snapshot_).
              super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi,0);
  _Var4._M_head_impl = extraout_RDX;
  if (local_28 != (buffer *)0x0) {
    (*local_30)();
    _Var4._M_head_impl = extraout_RDX_00;
  }
  bVar5._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl = _Var4._M_head_impl;
  bVar5._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)this;
  return (bufptr)bVar5._M_t.
                 super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
                 super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>;
}

Assistant:

bufptr snapshot_sync_req::serialize()
{
    bufptr snp_buf = snapshot_->serialize();
    bufptr buf = buffer::alloc(snp_buf->size() + sz_ulong + sz_byte + (data_->size() - data_->pos()));
    buf->put(*snp_buf);
    buf->put(offset_);
    buf->put(done_ ? (byte)1 : (byte)0);
    buf->put(*data_);
    buf->pos(0);
    return buf;
}